

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::RecordSchema::RecordSchema(RecordSchema *this,string *name)

{
  Node *this_00;
  NodeRecord *this_01;
  Name NStack_58;
  
  this_01 = (NodeRecord *)operator_new(0xd0);
  NodeRecord::NodeRecord(this_01);
  Schema::Schema(&this->super_Schema,(Node *)this_01);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00191510;
  this_00 = (this->super_Schema).node_.px;
  Name::Name(&NStack_58,name);
  Node::setName(this_00,&NStack_58);
  Name::~Name(&NStack_58);
  return;
}

Assistant:

RecordSchema::RecordSchema(const std::string &name) :
    Schema(new NodeRecord)
{
    node_->setName(name);
}